

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCMatVec.h
# Opt level: O3

void chrono::collision::Meigen(PQP_REAL (*vout) [3],PQP_REAL *dout,PQP_REAL (*a) [3])

{
  double dVar1;
  PQP_REAL *pPVar2;
  PQP_REAL *pPVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  PQP_REAL *pPVar10;
  PQP_REAL *pPVar11;
  PQP_REAL *pPVar12;
  PQP_REAL *pPVar13;
  PQP_REAL *pPVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  double dVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  PQP_REAL d [3];
  PQP_REAL z [3];
  PQP_REAL b [3];
  PQP_REAL v [3] [3];
  undefined1 local_f8 [16];
  double dStack_e8;
  ulong uStack_e0;
  double local_d8 [4];
  PQP_REAL (*local_b8) [3];
  PQP_REAL *local_b0;
  PQP_REAL *local_a8;
  PQP_REAL *local_a0;
  undefined1 local_98 [16];
  double dStack_88;
  undefined8 uStack_80;
  PQP_REAL local_78;
  PQP_REAL PStack_70;
  PQP_REAL PStack_68;
  PQP_REAL PStack_60;
  PQP_REAL PStack_58;
  PQP_REAL PStack_50;
  PQP_REAL PStack_48;
  PQP_REAL PStack_40;
  PQP_REAL local_38;
  
  local_b0 = dout;
  uVar4 = 0;
  local_b8 = vout;
  local_d8[2] = 0.0;
  local_38 = 1.0;
  PStack_58 = 1.0;
  local_78 = 1.0;
  PStack_70 = 0.0;
  PStack_68 = 0.0;
  PStack_60 = 0.0;
  PStack_50 = 0.0;
  PStack_48 = 0.0;
  local_d8[0] = 0.0;
  local_d8[1] = 0.0;
  PStack_40 = 0.0;
  auVar15 = vgatherdpd_avx512vl(*(undefined4 *)*a);
  auVar16._8_8_ = 0x7fffffffffffffff;
  auVar16._0_8_ = 0x7fffffffffffffff;
  local_a0 = *a + 1;
  local_a8 = a[1] + 1;
  auVar15._24_8_ = local_98._0_8_;
  _local_98 = auVar15;
  uStack_e0 = local_f8._0_8_;
  _local_f8 = auVar15._0_24_;
  do {
    local_d8[2] = 0.0;
    local_d8[1] = 0.0;
    local_d8[0] = 0.0;
    uVar6 = 0;
    dVar17 = 0.0;
    pPVar2 = *a;
    do {
      if (uVar6 < 2) {
        lVar8 = 1;
        do {
          auVar18._8_8_ = 0;
          auVar18._0_8_ = pPVar2[lVar8];
          lVar7 = uVar6 + 1 + lVar8;
          lVar8 = lVar8 + 1;
          auVar18 = vandpd_avx(auVar18,auVar16);
          dVar17 = dVar17 + auVar18._0_8_;
        } while (lVar7 != 3);
      }
      uVar6 = uVar6 + 1;
      pPVar2 = pPVar2 + 4;
    } while (uVar6 != 3);
    if ((dVar17 == 0.0) && (!NAN(dVar17))) {
      (*local_b8)[0] = local_78;
      (*local_b8)[1] = PStack_70;
      (*local_b8)[2] = PStack_68;
      local_b8[1][0] = PStack_60;
      local_b8[1][1] = PStack_58;
      local_b8[1][2] = PStack_50;
      local_b8[2][0] = PStack_48;
      local_b8[2][1] = PStack_40;
      local_b8[2][2] = local_38;
      *local_b0 = (PQP_REAL)local_f8._0_8_;
      local_b0[1] = (PQP_REAL)local_f8._8_8_;
      local_b0[2] = dStack_e8;
      return;
    }
    pPVar2 = &local_78;
    uStack_e0 = 1;
    pPVar3 = &PStack_70;
    uVar6 = 0;
    pPVar10 = local_a8;
    pPVar13 = local_a0;
    do {
      uVar9 = uVar6 + 1;
      if (uVar6 < 2) {
        lVar8 = 0;
        uVar5 = uStack_e0;
        pPVar12 = pPVar10;
        pPVar14 = pPVar3;
        do {
          pPVar11 = a[uVar6] + uVar5;
          dVar1 = *pPVar11;
          auVar24._8_8_ = 0;
          auVar24._0_8_ = dVar1;
          auVar18 = vandpd_avx(auVar24,auVar16);
          dVar21 = auVar18._0_8_ * 100.0;
          if (uVar4 < 4) {
LAB_00832633:
            if ((double)((ulong)(uVar4 < 3) * (long)((dVar17 * 0.2) / 9.0)) < auVar18._0_8_) {
              dVar28 = *(double *)(local_f8 + uVar5 * 8) - *(double *)(local_f8 + uVar6 * 8);
              auVar22._8_8_ = 0;
              auVar22._0_8_ = dVar28;
              auVar18 = vandpd_avx(auVar22,auVar16);
              dVar35 = auVar18._0_8_;
              if ((dVar21 + dVar35 != dVar35) || (NAN(dVar21 + dVar35) || NAN(dVar35))) {
                auVar19._0_8_ = (dVar28 * 0.5) / dVar1;
                auVar19._8_8_ = 0;
                auVar18 = vandpd_avx(auVar19,auVar16);
                auVar24 = vfmadd213sd_fma(auVar19,auVar19,ZEXT816(0x3ff0000000000000));
                auVar24 = vsqrtsd_avx(auVar24,auVar24);
                auVar36._0_8_ = 1.0 / (auVar18._0_8_ + auVar24._0_8_);
                auVar36._8_8_ = 0;
                if (auVar19._0_8_ < 0.0) {
                  auVar36._0_8_ = -auVar36._0_8_;
                  auVar36._8_8_ = 0x8000000000000000;
                }
              }
              else {
                auVar36._0_8_ = dVar1 / dVar28;
                auVar36._8_8_ = 0;
              }
              auVar18 = vfmadd213sd_fma(auVar36,auVar36,ZEXT816(0x3ff0000000000000));
              dVar1 = auVar36._0_8_ * dVar1;
              auVar18 = vsqrtsd_avx(auVar18,auVar18);
              *(double *)(local_f8 + uVar6 * 8) = *(double *)(local_f8 + uVar6 * 8) - dVar1;
              dVar21 = 1.0 / auVar18._0_8_;
              dVar28 = auVar36._0_8_ * dVar21;
              auVar23._0_8_ = dVar28 / (dVar21 + 1.0);
              auVar23._8_8_ = 0;
              local_d8[uVar6] = local_d8[uVar6] - dVar1;
              dVar21 = *(double *)(local_f8 + uVar5 * 8);
              local_d8[uVar5] = dVar1 + local_d8[uVar5];
              *(double *)(local_f8 + uVar5 * 8) = dVar1 + dVar21;
              *pPVar11 = 0.0;
              auVar20._8_8_ = 0;
              auVar20._0_8_ = dVar28;
              if (uVar6 == 1) {
                auVar25._8_8_ = 0;
                auVar25._0_8_ = (*a)[uVar5];
                auVar31._8_8_ = 0;
                auVar31._0_8_ = (*a)[1];
                auVar18 = vfmadd213sd_fma(auVar23,auVar31,auVar25);
                auVar24 = vfnmadd213sd_fma(auVar18,auVar20,auVar31);
                auVar18 = vfnmadd231sd_fma(auVar31,auVar25,auVar23);
                auVar18 = vfmadd213sd_fma(auVar18,auVar20,auVar25);
                (*a)[1] = auVar24._0_8_;
                (*a)[uVar5] = auVar18._0_8_;
              }
              if (uVar9 < uVar5) {
                auVar26._0_8_ = -dVar28;
                auVar26._8_8_ = 0x8000000000000000;
                lVar7 = 0;
                pPVar11 = pPVar12;
                do {
                  auVar32._8_8_ = 0;
                  auVar32._0_8_ = pPVar13[lVar7];
                  auVar37._8_8_ = 0;
                  auVar37._0_8_ = *pPVar11;
                  auVar18 = vfmadd213sd_fma(auVar23,auVar32,auVar37);
                  auVar18 = vfmadd213sd_fma(auVar18,auVar26,auVar32);
                  auVar24 = vfnmadd231sd_fma(auVar32,auVar37,auVar23);
                  auVar24 = vfmadd213sd_fma(auVar24,auVar20,auVar37);
                  pPVar13[lVar7] = auVar18._0_8_;
                  lVar7 = lVar7 + 1;
                  *pPVar11 = auVar24._0_8_;
                  pPVar11 = pPVar11 + 3;
                } while (lVar8 != lVar7);
              }
              auVar27._0_8_ = -dVar28;
              auVar27._8_8_ = 0x8000000000000000;
              if (uVar5 < 2) {
                auVar33._8_8_ = 0;
                auVar33._0_8_ = a[uVar6][uVar5 + 1];
                auVar38._8_8_ = 0;
                auVar38._0_8_ = a[uVar5][uVar5 + 1];
                auVar18 = vfmadd213sd_fma(auVar23,auVar33,auVar38);
                auVar18 = vfmadd213sd_fma(auVar18,auVar27,auVar33);
                auVar24 = vfnmadd231sd_fma(auVar33,auVar38,auVar23);
                auVar24 = vfmadd213sd_fma(auVar24,auVar20,auVar38);
                a[uVar6][uVar5 + 1] = auVar18._0_8_;
                a[uVar5][uVar5 + 1] = auVar24._0_8_;
              }
              lVar7 = 0;
              do {
                auVar34._8_8_ = 0;
                auVar34._0_8_ = *(ulong *)((long)pPVar2 + lVar7);
                auVar39._8_8_ = 0;
                auVar39._0_8_ = *(ulong *)((long)pPVar14 + lVar7);
                auVar18 = vfmadd213sd_fma(auVar23,auVar34,auVar39);
                auVar18 = vfmadd213sd_fma(auVar18,auVar27,auVar34);
                auVar24 = vfnmadd231sd_fma(auVar34,auVar39,auVar23);
                auVar24 = vfmadd213sd_fma(auVar24,auVar20,auVar39);
                *(long *)((long)pPVar2 + lVar7) = auVar18._0_8_;
                *(long *)((long)pPVar14 + lVar7) = auVar24._0_8_;
                lVar7 = lVar7 + 0x18;
              } while (lVar7 != 0x48);
            }
          }
          else {
            auVar29._8_8_ = 0;
            auVar29._0_8_ = *(ulong *)(local_f8 + uVar6 * 8);
            auVar24 = vandpd_avx(auVar29,auVar16);
            dVar28 = auVar24._0_8_;
            if ((dVar21 + dVar28 != dVar28) || (NAN(dVar21 + dVar28) || NAN(dVar28)))
            goto LAB_00832633;
            auVar30._8_8_ = 0;
            auVar30._0_8_ = *(ulong *)(local_f8 + uVar5 * 8);
            auVar24 = vandpd_avx(auVar30,auVar16);
            dVar28 = auVar24._0_8_;
            if ((dVar21 + dVar28 != dVar28) || (NAN(dVar21 + dVar28) || NAN(dVar28)))
            goto LAB_00832633;
            *pPVar11 = 0.0;
          }
          uVar5 = uVar5 + 1;
          pPVar12 = pPVar12 + 1;
          lVar8 = lVar8 + 1;
          pPVar14 = pPVar14 + 1;
        } while (uVar5 != 3);
      }
      dVar28 = local_d8[2];
      dVar21 = local_d8[1];
      dVar1 = local_d8[0];
      uStack_e0 = uStack_e0 + 1;
      pPVar13 = pPVar13 + 4;
      pPVar10 = pPVar10 + 4;
      pPVar2 = pPVar2 + 1;
      pPVar3 = pPVar3 + 1;
      uVar6 = uVar9;
    } while (uVar9 != 3);
    uVar4 = uVar4 + 1;
    local_d8[0] = 0.0;
    local_d8[1] = 0.0;
    local_d8[2] = 0.0;
    local_f8._0_8_ = dVar1 + local_98._0_8_;
    local_f8._8_8_ = dVar21 + local_98._8_8_;
    dStack_e8 = dVar28 + local_98._16_8_;
    local_98._8_8_ = local_f8._8_8_;
    local_98._0_8_ = local_f8._0_8_;
    dStack_88 = dStack_e8;
    if (uVar4 == 0x32) {
      Meigen();
      return;
    }
  } while( true );
}

Assistant:

void inline Meigen(PQP_REAL vout[3][3], PQP_REAL dout[3], PQP_REAL a[3][3]) {
    int n = 3;
    int j, iq, ip, i;
    PQP_REAL tresh, theta, tau, t, sm, s, h, g, c;
    int nrot;
    PQP_REAL b[3];
    PQP_REAL z[3];
    PQP_REAL v[3][3];
    PQP_REAL d[3];

    Midentity(v);
    for (ip = 0; ip < n; ip++) {
        b[ip] = a[ip][ip];
        d[ip] = a[ip][ip];
        z[ip] = 0.0;
    }

    nrot = 0;

    for (i = 0; i < 50; i++) {
        sm = 0.0;
        for (ip = 0; ip < n; ip++)
            for (iq = ip + 1; iq < n; iq++)
                sm += fabs(a[ip][iq]);
        if (sm == 0.0) {
            McM(vout, v);
            VcV(dout, d);
            return;
        }

        if (i < 3)
            tresh = (PQP_REAL)0.2 * sm / (n * n);
        else
            tresh = 0.0;

        for (ip = 0; ip < n; ip++)
            for (iq = ip + 1; iq < n; iq++) {
                g = (PQP_REAL)100.0 * fabs(a[ip][iq]);
                if (i > 3 && fabs(d[ip]) + g == fabs(d[ip]) && fabs(d[iq]) + g == fabs(d[iq]))
                    a[ip][iq] = 0.0;
                else if (fabs(a[ip][iq]) > tresh) {
                    h = d[iq] - d[ip];
                    if (fabs(h) + g == fabs(h))
                        t = (a[ip][iq]) / h;
                    else {
                        theta = (PQP_REAL)0.5 * h / (a[ip][iq]);
                        t = (PQP_REAL)(1.0 / (fabs(theta) + sqrt(1.0 + theta * theta)));
                        if (theta < 0.0)
                            t = -t;
                    }
                    c = (PQP_REAL)1.0 / sqrt(1 + t * t);
                    s = t * c;
                    tau = s / ((PQP_REAL)1.0 + c);
                    h = t * a[ip][iq];
                    z[ip] -= h;
                    z[iq] += h;
                    d[ip] -= h;
                    d[iq] += h;
                    a[ip][iq] = 0.0;
                    for (j = 0; j < ip; j++) {
                        ROTATE(a, j, ip, j, iq);
                    }
                    for (j = ip + 1; j < iq; j++) {
                        ROTATE(a, ip, j, j, iq);
                    }
                    for (j = iq + 1; j < n; j++) {
                        ROTATE(a, ip, j, iq, j);
                    }
                    for (j = 0; j < n; j++) {
                        ROTATE(v, j, ip, j, iq);
                    }
                    nrot++;
                }
            }
        for (ip = 0; ip < n; ip++) {
            b[ip] += z[ip];
            d[ip] = b[ip];
            z[ip] = 0.0;
        }
    }

    fprintf(stderr, "eigen: too many iterations in Jacobi transform.\n");

    return;
}